

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_short(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  Status myStatus;
  Status myStatus_14;
  char lex_v_ran_iv_2 [7];
  char lex_v_ran_iv_1 [7];
  char lex_v_ran_v_2 [7];
  char lex_v_ran_v_1 [7];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char lex_v_ran_v_1_canrep [6];
  char lex_v_ran_v_2_canrep [7];
  char lex_v_ran_iv_1_canrep [6];
  char lex_v_ran_iv_2_canrep [7];
  char data_rawstr_2 [9];
  char data_rawstr_1 [14];
  char lex_v_ran_v_0 [14];
  StrX local_e8;
  char *local_d8;
  Status local_cc;
  char local_c8 [8];
  char local_c0 [8];
  char local_b8 [8];
  char local_b0 [8];
  char local_a8 [8];
  undefined8 local_a0;
  undefined1 local_98;
  char local_94 [8];
  char local_8c [8];
  char local_84 [8];
  char local_7c [8];
  char local_74 [8];
  int local_6c;
  char local_68 [8];
  char local_60 [16];
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40 + 8,"    \n",6);
  builtin_strncpy(local_40,"    1234",8);
  builtin_strncpy(local_b0,"+32767",7);
  builtin_strncpy(local_b8,"-32768",7);
  builtin_strncpy(local_c0,"+32768",7);
  builtin_strncpy(local_c8,"-32769",7);
  builtin_strncpy(local_84,"32767",6);
  builtin_strncpy(local_7c,"-32768",7);
  builtin_strncpy(local_74,"32768",6);
  builtin_strncpy(local_68,"-32769",7);
  local_98 = 0;
  local_a0 = 0x3635342e34333231;
  builtin_strncpy(local_a8,"1234b56",8);
  builtin_strncpy(local_50 + 8,"5   \n",6);
  builtin_strncpy(local_50,"   +1234",8);
  builtin_strncpy(local_8c,"12345",6);
  builtin_strncpy(local_60,"00012345",9);
  builtin_strncpy(local_94,"12345",6);
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x822,local_40,local_e8.fLocalForm,1);
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x823,local_b0,local_e8.fLocalForm,1);
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x824,local_b8,local_e8.fLocalForm,1);
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    if ((int)local_d8 != 6) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      if (((ulong)local_d8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x827,local_c0,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00111f41;
    }
  }
  else {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x827,local_c0,local_e8.fLocalForm,0);
LAB_00111f41:
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    if ((int)local_d8 != 6) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      if (((ulong)local_d8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x828,local_c8,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00112035;
    }
  }
  else {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x828,local_c8,local_e8.fLocalForm,0);
LAB_00112035:
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    if ((int)local_d8 != 6) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      if (((ulong)local_d8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x82b,&local_a0,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00112129;
    }
  }
  else {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x82b,&local_a0,local_e8.fLocalForm,0);
LAB_00112129:
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (cVar2 == '\0') {
    if ((int)local_d8 != 6) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      if (((ulong)local_d8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x82c,local_a8,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011221d;
    }
  }
  else {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x82c,local_a8,local_e8.fLocalForm,0);
LAB_0011221d:
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_6c = iVar9;
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x849,local_40);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(uint)(int)*(short *)(pXVar3 + 8);
      if ((int)*(short *)(pXVar3 + 8) != 0x4d2) {
        printf("ACTVALUE_TEST Unexpected dt_short XSValue, got %d expected %d\n",pvVar7,0x4d2);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = local_6c;
    bVar10 = local_6c == 1;
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,bVar10,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84b,local_b0);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(uint)(int)*(short *)(pXVar3 + 8);
      if ((int)*(short *)(pXVar3 + 8) != 0x7fff) {
        printf("ACTVALUE_TEST Unexpected dt_short XSValue, got %d expected %d\n",pvVar7,0x7fff);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84c,local_b8);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(uint)(int)*(short *)(pXVar3 + 8);
      if ((int)*(short *)(pXVar3 + 8) != 0xffff8000) {
        printf("ACTVALUE_TEST Unexpected dt_short XSValue, got %d expected %d\n",pvVar7,0xffff8000);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_d8 != 6) {
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_d8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x84d,local_c0,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      pvVar7 = (void *)0x84d;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84d,local_c0);
      StrX::~StrX(&local_e8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_d8 != 6) {
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_d8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x84e,local_c8,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      pvVar7 = (void *)0x84e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84e,local_c8);
      StrX::~StrX(&local_e8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_d8 != 6) {
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_d8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x850,&local_a0,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      pvVar7 = (void *)0x850;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x850,&local_a0);
      StrX::~StrX(&local_e8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_d8 != 6) {
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_d8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x851,local_a8,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      pvVar7 = (void *)0x851;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x851,local_a8);
      StrX::~StrX(&local_e8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 0;
  do {
    local_cc = st_Init;
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_e8.fUnicodeForm,dt_short,&local_cc,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x86f,local_50);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      local_d8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_8c;
      if (local_d8 != pcVar8) {
        pcVar5 = local_d8;
        if (local_d8 == (char *)0x0) {
LAB_00112a1c:
          if (*pcVar8 == '\0') goto LAB_00112a69;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00112a1c;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x86f,local_50,local_e8.fLocalForm,local_d8,local_8c);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
LAB_00112a69:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_cc = st_Init;
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_e8.fUnicodeForm,dt_short,&local_cc,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x870,local_60);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      local_d8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_94;
      if (local_d8 != pcVar8) {
        pcVar5 = local_d8;
        if (local_d8 == (char *)0x0) {
LAB_00112b66:
          if (*pcVar8 == '\0') goto LAB_00112bb3;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00112b66;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x870,local_60,local_e8.fLocalForm,local_d8,local_94);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
LAB_00112bb3:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_cc = st_Init;
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_e8.fUnicodeForm,dt_short,&local_cc,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x872,local_b0);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      local_d8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_84;
      if (local_d8 != pcVar8) {
        pcVar5 = local_d8;
        if (local_d8 == (char *)0x0) {
LAB_00112caa:
          if (*pcVar8 == '\0') goto LAB_00112cf4;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00112caa;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x872,local_b0,local_e8.fLocalForm,local_d8,local_84);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
LAB_00112cf4:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_cc = st_Init;
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_e8.fUnicodeForm,dt_short,&local_cc,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x873,local_b8);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
    else {
      local_d8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_7c;
      if (local_d8 != pcVar8) {
        pcVar5 = local_d8;
        if (local_d8 == (char *)0x0) {
LAB_00112df0:
          if (*pcVar8 == '\0') goto LAB_00112e3a;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00112df0;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x873,local_b8,local_e8.fLocalForm,local_d8,local_7c);
        StrX::~StrX(&local_e8);
        errSeen = 1;
      }
LAB_00112e3a:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (lVar6 == 0) {
      if ((int)local_d8 != 6) {
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_d8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x875,&local_a0,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_e8);
        goto LAB_00112f54;
      }
    }
    else {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x875,&local_a0);
      StrX::~StrX(&local_e8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00112f54:
      errSeen = 1;
    }
    local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
    local_e8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_e8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_e8);
    if (lVar6 == 0) {
      if ((int)local_d8 != 6) {
        StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_d8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x876,local_a8,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_e8);
        goto LAB_0011305c;
      }
    }
    else {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x876,local_a8);
      StrX::~StrX(&local_e8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011305c:
      errSeen = 1;
    }
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar10);
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (lVar6 == 0) {
    if ((int)local_d8 != 6) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      if (((ulong)local_d8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x87b,local_c0,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_e8);
      goto LAB_00113177;
    }
  }
  else {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x87b,local_c0);
    StrX::~StrX(&local_e8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00113177:
    errSeen = 1;
  }
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_e8.fUnicodeForm,dt_short,(Status *)&local_d8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (lVar6 == 0) {
    if ((int)local_d8 != 6) {
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      if (((ulong)local_d8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_d8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x87c,local_c8,local_e8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_e8);
      goto LAB_00113282;
    }
  }
  else {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x87c,local_c8);
    StrX::~StrX(&local_e8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00113282:
    errSeen = 1;
  }
  local_cc = st_Init;
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_e8.fUnicodeForm,dt_short,&local_cc,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x87f,local_c0);
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
  else {
    local_d8 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar8 = local_74;
    if (local_d8 != pcVar8) {
      pcVar5 = local_d8;
      if (local_d8 == (char *)0x0) {
LAB_0011335c:
        if (*pcVar8 == '\0') goto LAB_001133a8;
      }
      else {
        do {
          cVar2 = *pcVar5;
          if (cVar2 == '\0') goto LAB_0011335c;
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x87f,local_c0,local_e8.fLocalForm,local_d8,local_74);
      StrX::~StrX(&local_e8);
      errSeen = 1;
    }
LAB_001133a8:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_cc = st_Init;
  local_e8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_e8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_e8.fUnicodeForm,dt_short,&local_cc,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x880,local_c8,local_e8.fLocalForm);
    StrX::~StrX(&local_e8);
    errSeen = 1;
    return;
  }
  local_d8 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar8 = local_68;
  if (local_d8 != pcVar8) {
    pcVar5 = local_d8;
    if (local_d8 == (char *)0x0) {
LAB_00113499:
      if (*pcVar8 == '\0') goto LAB_001134e8;
    }
    else {
      do {
        cVar2 = *pcVar5;
        if (cVar2 == '\0') goto LAB_00113499;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_e8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0x880,local_c8,local_e8.fLocalForm,local_d8,local_68);
    StrX::~StrX(&local_e8);
    errSeen = 1;
  }
LAB_001134e8:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_short()
{
    const XSValue::DataType dt = XSValue::dt_short;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234    \n";

    const char lex_v_ran_v_1[]="+32767";
    const char lex_v_ran_v_2[]="-32768";
    const char lex_v_ran_iv_1[]="+32768";
    const char lex_v_ran_iv_2[]="-32769";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_short = (short)1234;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_short = (short)+32767;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_short = (short)-32768;

    const char lex_v_ran_v_1_canrep[]="32767";
    const char lex_v_ran_v_2_canrep[]="-32768";
    const char lex_v_ran_iv_1_canrep[]="32768";
    const char lex_v_ran_iv_2_canrep[]="-32769";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 *
 * 3.3.18.2 Canonical representation
 *
 * The canonical representation for short is defined by prohibiting certain options from the
 * Lexical representation (3.3.18.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}